

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<cm::optional<FixturesOptions>,_cmCMakePresetsGraph::ReadFileResult> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>>
          (cmJSONHelper<cm::optional<FixturesOptions>,_cmCMakePresetsGraph::ReadFileResult>
           *__return_storage_ptr__,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *this,
          ReadFileResult success,
          Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions> *func)

{
  undefined4 in_register_00000014;
  anon_class_48_2_05117e18 local_50;
  Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions> *local_20;
  Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions> *func_local;
  cmJSONHelper<cm::optional<FixturesOptions>,_cmCMakePresetsGraph::ReadFileResult> *pcStack_10;
  ReadFileResult success_local;
  
  local_20 = (Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions> *)
             CONCAT44(in_register_00000014,success);
  local_50.success = (ReadFileResult)this;
  func_local._4_4_ = local_50.success;
  pcStack_10 = __return_storage_ptr__;
  Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>::Object
            (&local_50.func,local_20);
  std::
  function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>>(cmCMakePresetsGraph::ReadFileResult,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>)::_lambda(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)>
              *)__return_storage_ptr__,&local_50);
  Optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>>(cmCMakePresetsGraph::ReadFileResult,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>)
  ::
  {lambda(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>&,Json::Value_const*)#1}
  ::~function((_lambda_std__optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>__Json__Value_const___1_
               *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<cm::optional<T>, E, CallState...> Optional(E success,
                                                                 F func)
  {
    return [success, func](cm::optional<T>& out, const Json::Value* value,
                           CallState&&... state) -> E {
      if (!value) {
        out.reset();
        return success;
      }
      out.emplace();
      return func(*out, value, std::forward(state)...);
    };
  }